

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1f2d20::RSTFormatter::Write(RSTFormatter *this,CStringRef s)

{
  BasicStringRef<char> value;
  BasicWriter<char> *this_00;
  long in_RDI;
  size_t length;
  char *word_end;
  char *word_start;
  char *p;
  undefined8 in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 uVar1;
  BasicStringRef<char> local_40;
  char *pcVar2;
  char *s_00;
  char *local_18;
  BasicCStringRef<char> local_8;
  
  local_18 = fmt::BasicCStringRef<char>::c_str(&local_8);
  do {
    for (; s_00 = local_18, *local_18 == ' '; local_18 = local_18 + 1) {
    }
    while( true ) {
      uVar1 = false;
      if ((*local_18 != ' ') && (uVar1 = false, *local_18 != '\n')) {
        uVar1 = *local_18 != '\0';
      }
      if ((bool)uVar1 == false) break;
      local_18 = local_18 + 1;
    }
    pcVar2 = local_18;
    if (0x4e < (long)(local_18 +
                     (long)(int)(uint)(*(int *)(in_RDI + 0x74) != 0) +
                     ((long)*(int *)(in_RDI + 0x74) - (long)s_00))) {
      EndLine((RSTFormatter *)(ulong)in_stack_ffffffffffffffb0);
    }
    if (*(int *)(in_RDI + 0x74) == 0) {
      Indent((RSTFormatter *)CONCAT17(uVar1,in_stack_ffffffffffffffb0));
    }
    else {
      fmt::BasicWriter<char>::operator<<
                ((BasicWriter<char> *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),
                 (char)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
      *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) + 1;
    }
    this_00 = (BasicWriter<char> *)(pcVar2 + -(long)s_00);
    in_stack_ffffffffffffffa8 = *(undefined8 *)(in_RDI + 8);
    fmt::BasicStringRef<char>::BasicStringRef(&local_40,s_00,(size_t)this_00);
    value.size_ = (size_t)s_00;
    value.data_ = pcVar2;
    fmt::BasicWriter<char>::operator<<(this_00,value);
    *(int *)(in_RDI + 0x74) = (int)this_00 + *(int *)(in_RDI + 0x74);
    if (*local_18 == '\n') {
      EndLine((RSTFormatter *)CONCAT17(uVar1,in_stack_ffffffffffffffb0));
      local_18 = local_18 + 1;
    }
  } while (*local_18 != '\0');
  return;
}

Assistant:

void RSTFormatter::Write(fmt::CStringRef s) {
  enum { MAX_LINE_LENGTH = 78 };
  const char *p = s.c_str();
  for (;;) {
    // Skip leading spaces.
    while (*p == ' ')
      ++p;
    const char *word_start = p;
    while (*p != ' ' && *p != '\n' && *p)
      ++p;
    const char *word_end = p;
    if (pos_in_line_ + (word_end - word_start) +
        (pos_in_line_ == 0 ? 0 : 1) > MAX_LINE_LENGTH) {
      EndLine();  // The word doesn't fit in the current line, start a new one.
    }
    if (pos_in_line_ == 0) {
      Indent();
    } else {
      // Separate words.
      writer_ << ' ';
      ++pos_in_line_;
    }
    std::size_t length = word_end - word_start;
    writer_ << fmt::StringRef(word_start, length);
    pos_in_line_ += static_cast<int>(length);
    if (*p == '\n') {
      EndLine();
      ++p;
    }
    if (!*p) break;
  }
}